

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void free_thread_data(AV1_PRIMARY *ppi)

{
  int *piVar1;
  PC_TREE *pc_tree;
  long in_RDI;
  int y;
  int x;
  int j;
  ThreadData_conflict *td;
  EncWorkerData *thread_data;
  int t;
  int num_planes;
  int is_highbitdepth;
  int num_tpl_workers;
  int num_tf_workers;
  PrimaryMultiThreadInfo *p_mt_info;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  int iVar3;
  int local_48;
  int local_44;
  int iVar4;
  PARTITION_SEARCH_TYPE partition_search_type;
  int keep_none;
  PICK_MODE_CONTEXT *pPVar5;
  int local_24;
  
  piVar1 = (int *)(in_RDI + 0x123d0);
  if (*(int *)(in_RDI + 0x123d8) < *piVar1) {
    local_48 = *(int *)(in_RDI + 0x123d8);
  }
  else {
    local_48 = *piVar1;
  }
  if (*(int *)(in_RDI + 0x123dc) < *piVar1) {
    iVar2 = *(int *)(in_RDI + 0x123dc);
  }
  else {
    iVar2 = *piVar1;
  }
  iVar3 = iVar2;
  for (local_24 = 1; local_24 < *piVar1; local_24 = local_24 + 1) {
    pc_tree = (PC_TREE *)(*(long *)(in_RDI + 0x12410) + (long)local_24 * 0x1d0);
    pc_tree->none = pc_tree->horizontal[0];
    pPVar5 = pc_tree->none;
    if (pPVar5 != (PICK_MODE_CONTEXT *)0x0) {
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      release_compound_type_rd_buffers((CompoundTypeRdBuffers *)0x2190f4);
      for (keep_none = 0; keep_none < 2; keep_none = keep_none + 1) {
        aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      }
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      release_obmc_buffers((OBMCBuffer *)0x21915a);
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      for (iVar4 = 0; iVar4 < 2; iVar4 = iVar4 + 1) {
        for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
          aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
          pPVar5[0x147].txb_entropy_ctx[(long)iVar4 * 2 + (long)local_44 + 10] = (uint8_t *)0x0;
        }
      }
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      partition_search_type = (PARTITION_SEARCH_TYPE)((uint)iVar4 >> 0x18);
      pPVar5[0x144].dqcoeff[0] = (tran_low_t *)0x0;
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      pPVar5[0x144].dqcoeff[1] = (tran_low_t *)0x0;
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      av1_free_pmc((PICK_MODE_CONTEXT *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
      pPVar5[0x148].mbmi_ext_best.ref_mv_stack[3].this_mv = (int_mv)0x0;
      pPVar5[0x148].mbmi_ext_best.ref_mv_stack[3].comp_mv = (int_mv)0x0;
      av1_free_shared_coeff_buffer
                ((PC_TREE_SHARED_BUFFERS *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      av1_free_sms_tree((ThreadData_conflict *)0x219281);
      if (local_24 < local_48) {
        tf_dealloc_data((TemporalFilterData *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
      }
      if (local_24 < iVar2) {
        tpl_dealloc_temp_buffers((TplBuffers *)0x2192bb);
      }
      gm_dealloc_data((GlobalMotionData *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      av1_dealloc_mb_data((macroblock *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      pPVar5[0x144].qcoeff[0] = (tran_low_t *)0x0;
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      pPVar5[0x144].qcoeff[1] = (tran_low_t *)0x0;
      av1_free_pc_tree_recursive
                (pc_tree,(int)((ulong)pPVar5 >> 0x20),(int)pPVar5,keep_none,partition_search_type);
      *(undefined8 *)(pPVar5[0x151].mbmi_ext_best.global_mvs + 7) = 0;
      av1_dealloc_mb_wiener_var_pred_buf((ThreadData_conflict *)0x219354);
      aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      pc_tree->none = (PICK_MODE_CONTEXT *)0x0;
      pc_tree->horizontal[0] = (PICK_MODE_CONTEXT *)0x0;
    }
  }
  return;
}

Assistant:

static inline void free_thread_data(AV1_PRIMARY *ppi) {
  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;
  const int num_tf_workers =
      AOMMIN(p_mt_info->num_mod_workers[MOD_TF], p_mt_info->num_workers);
  const int num_tpl_workers =
      AOMMIN(p_mt_info->num_mod_workers[MOD_TPL], p_mt_info->num_workers);
  const int is_highbitdepth = ppi->seq_params.use_highbitdepth;
  const int num_planes = ppi->seq_params.monochrome ? 1 : MAX_MB_PLANE;
  for (int t = 1; t < p_mt_info->num_workers; ++t) {
    EncWorkerData *const thread_data = &p_mt_info->tile_thr_data[t];
    thread_data->td = thread_data->original_td;
    ThreadData *const td = thread_data->td;
    if (!td) continue;
    aom_free(td->tctx);
    aom_free(td->palette_buffer);
    aom_free(td->tmp_conv_dst);
    release_compound_type_rd_buffers(&td->comp_rd_buffer);
    for (int j = 0; j < 2; ++j) {
      aom_free(td->tmp_pred_bufs[j]);
    }
    aom_free(td->pixel_gradient_info);
    aom_free(td->src_var_info_of_4x4_sub_blocks);
    release_obmc_buffers(&td->obmc_buffer);
    aom_free(td->vt64x64);

    for (int x = 0; x < 2; x++) {
      for (int y = 0; y < 2; y++) {
        aom_free(td->hash_value_buffer[x][y]);
        td->hash_value_buffer[x][y] = NULL;
      }
    }
    aom_free(td->mv_costs_alloc);
    td->mv_costs_alloc = NULL;
    aom_free(td->dv_costs_alloc);
    td->dv_costs_alloc = NULL;
    aom_free(td->counts);
    av1_free_pmc(td->firstpass_ctx, num_planes);
    td->firstpass_ctx = NULL;
    av1_free_shared_coeff_buffer(&td->shared_coeff_buf);
    av1_free_sms_tree(td);
    // This call ensures that the buffers allocated by tf_alloc_and_reset_data()
    // in prepare_tf_workers() for MT encode are freed in case an error is
    // encountered during temporal filtering (due to early termination
    // tf_dealloc_thread_data() in av1_tf_do_filtering_mt() would not be
    // invoked).
    if (t < num_tf_workers) tf_dealloc_data(&td->tf_data, is_highbitdepth);
    // This call ensures that tpl_tmp_buffers for MT encode are freed in case of
    // an error during tpl.
    if (t < num_tpl_workers) tpl_dealloc_temp_buffers(&td->tpl_tmp_buffers);
    // This call ensures that the buffers in gm_data for MT encode are freed in
    // case of an error during gm.
    gm_dealloc_data(&td->gm_data);
    av1_dealloc_mb_data(&td->mb, num_planes);
    aom_free(td->mb.sb_stats_cache);
    td->mb.sb_stats_cache = NULL;
    aom_free(td->mb.sb_fp_stats);
    td->mb.sb_fp_stats = NULL;
#if CONFIG_PARTITION_SEARCH_ORDER
    aom_free(td->mb.rdcost);
    td->mb.rdcost = NULL;
#endif
    av1_free_pc_tree_recursive(td->pc_root, num_planes, 0, 0, SEARCH_PARTITION);
    td->pc_root = NULL;
    av1_dealloc_mb_wiener_var_pred_buf(td);
    aom_free(td);
    thread_data->td = NULL;
    thread_data->original_td = NULL;
  }
}